

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_upscale(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  ulong uVar2;
  ggml_tensor *pgVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  char *pcVar27;
  long lVar28;
  long lVar29;
  undefined4 *puVar30;
  undefined8 uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  long local_d8;
  long local_c8;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  
  pgVar3 = dst->src[0];
  if (pgVar3->type != GGML_TYPE_F32) {
    pcVar27 = "fatal error";
    uVar31 = 0x19d0;
LAB_0014349a:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,uVar31,pcVar27);
  }
  lVar22 = (long)params->ith;
  lVar23 = (long)params->nth;
  sVar4 = pgVar3->nb[0];
  sVar5 = pgVar3->nb[1];
  sVar6 = pgVar3->nb[2];
  sVar7 = pgVar3->nb[3];
  lVar8 = dst->ne[0];
  lVar9 = dst->ne[1];
  lVar10 = dst->ne[2];
  lVar11 = dst->ne[3];
  sVar12 = dst->nb[0];
  sVar13 = dst->nb[1];
  sVar14 = dst->nb[2];
  fVar38 = (float)lVar8 / (float)pgVar3->ne[0];
  fVar39 = (float)lVar9 / (float)pgVar3->ne[1];
  fVar40 = (float)lVar10 / (float)pgVar3->ne[2];
  fVar41 = (float)lVar11 / (float)pgVar3->ne[3];
  sVar15 = dst->nb[3];
  if (dst->op_params[0] == 0) {
    if (0 < lVar11) {
      local_d8 = sVar14 * lVar22;
      local_c8 = 0;
      do {
        if (lVar22 < lVar10) {
          lVar24 = lVar22;
          lVar26 = local_d8;
          do {
            if (0 < lVar9) {
              lVar34 = 0;
              lVar29 = lVar26;
              do {
                if (0 < lVar8) {
                  pvVar16 = pgVar3->data;
                  puVar30 = (undefined4 *)((long)dst->data + lVar29);
                  lVar35 = 0;
                  do {
                    *puVar30 = *(undefined4 *)
                                ((long)pvVar16 +
                                (long)((float)lVar35 / fVar38) * sVar4 +
                                (long)((float)lVar24 / fVar40) * sVar6 +
                                (long)((float)local_c8 / fVar41) * sVar7 +
                                (long)((float)lVar34 / fVar39) * sVar5);
                    lVar35 = lVar35 + 1;
                    puVar30 = (undefined4 *)((long)puVar30 + sVar12);
                  } while (lVar8 != lVar35);
                }
                lVar34 = lVar34 + 1;
                lVar29 = lVar29 + sVar13;
              } while (lVar34 != lVar9);
            }
            lVar24 = lVar24 + lVar23;
            lVar26 = lVar26 + sVar14 * lVar23;
          } while (lVar24 < lVar10);
        }
        local_c8 = local_c8 + 1;
        local_d8 = local_d8 + sVar15;
      } while (local_c8 != lVar11);
    }
  }
  else {
    if (dst->op_params[0] != 1) {
      pcVar27 = "unsupported upscale mode";
      uVar31 = 0x19bf;
      goto LAB_0014349a;
    }
    if (0 < lVar11) {
      uVar2 = pgVar3->ne[1] - 1;
      uVar32 = pgVar3->ne[0] - 1;
      local_a0 = sVar14 * lVar22;
      local_a8 = 0;
      do {
        if (lVar22 < lVar10) {
          lVar24 = (long)((float)local_a8 / fVar41) * sVar7;
          local_90 = local_a0;
          local_98 = lVar22;
          do {
            if (0 < lVar9) {
              lVar29 = (long)((float)local_98 / fVar40) * sVar6;
              local_d8 = local_90;
              lVar26 = 0;
              do {
                fVar17 = ((float)lVar26 + 0.5) / fVar39 + -0.5;
                auVar18 = vroundss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17),9);
                uVar20 = (ulong)auVar18._0_4_;
                uVar25 = uVar20;
                if ((long)uVar2 < (long)uVar20) {
                  uVar25 = uVar2;
                }
                if (0 < lVar8) {
                  uVar25 = ~((long)uVar25 >> 0x3f) & uVar25;
                  auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                       ZEXT416((uint)(fVar17 - (float)(long)uVar25)));
                  auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x40);
                  uVar21 = uVar20 + 1;
                  if ((long)uVar2 < (long)(uVar20 + 1)) {
                    uVar21 = uVar2;
                  }
                  pvVar16 = pgVar3->data;
                  fVar17 = 1.0 - auVar18._0_4_;
                  puVar30 = (undefined4 *)((long)dst->data + local_d8);
                  lVar34 = 0;
                  do {
                    fVar42 = ((float)lVar34 + 0.5) / fVar38 + -0.5;
                    auVar19 = vroundss_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),9);
                    uVar36 = (ulong)auVar19._0_4_;
                    uVar20 = uVar32;
                    if ((long)uVar36 <= (long)uVar32) {
                      uVar20 = uVar36;
                    }
                    uVar33 = uVar32;
                    if ((long)(uVar36 + 1) <= (long)uVar32) {
                      uVar33 = uVar36 + 1;
                    }
                    uVar20 = ~((long)uVar20 >> 0x3f) & uVar20;
                    auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                         ZEXT416((uint)(fVar42 - (float)(long)uVar20)));
                    auVar19 = vmaxss_avx(auVar19,ZEXT816(0) << 0x40);
                    lVar28 = uVar20 * sVar4;
                    lVar35 = uVar25 * sVar5 + lVar29;
                    lVar37 = (~((long)uVar33 >> 0x3f) & uVar33) * sVar4;
                    lVar1 = (~((long)uVar21 >> 0x3f) & uVar21) * sVar5 + lVar29;
                    fVar42 = auVar19._0_4_;
                    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar42 * *(float *)((long)
                                                  pvVar16 + lVar24 + lVar35 + lVar37))),
                                              ZEXT416((uint)fVar17),
                                              ZEXT416((uint)((1.0 - fVar42) *
                                                            *(float *)((long)pvVar16 +
                                                                      lVar24 + lVar35 + lVar28))));
                    auVar19 = vfmadd213ss_fma(ZEXT416((uint)((1.0 - fVar42) *
                                                            *(float *)((long)pvVar16 +
                                                                      lVar24 + lVar1 + lVar28))),
                                              auVar18,auVar19);
                    auVar19 = vfmadd213ss_fma(ZEXT416((uint)(fVar42 * *(float *)((long)pvVar16 +
                                                                                lVar24 + lVar1 + 
                                                  lVar37))),auVar18,auVar19);
                    *puVar30 = auVar19._0_4_;
                    lVar34 = lVar34 + 1;
                    puVar30 = (undefined4 *)((long)puVar30 + sVar12);
                  } while (lVar8 != lVar34);
                }
                lVar26 = lVar26 + 1;
                local_d8 = local_d8 + sVar13;
              } while (lVar26 != lVar9);
            }
            local_98 = local_98 + lVar23;
            local_90 = local_90 + sVar14 * lVar23;
          } while (local_98 < lVar10);
        }
        local_a8 = local_a8 + 1;
        local_a0 = local_a0 + sVar15;
      } while (local_a8 != lVar11);
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_upscale(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_upscale_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}